

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<kj::_::DebugComparison<std::__cxx11::string,std::__cxx11::string&>&>
          (String *__return_storage_ptr__,kj *this,
          DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *params)

{
  ArrayPtr<const_char> *in_R8;
  StringPtr local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  String local_28;
  
  local_38 = *(undefined8 *)this;
  uStack_30 = *(undefined8 *)(this + 8);
  local_48.content.ptr = (char *)**(undefined8 **)(this + 0x20);
  local_48.content.size_ = (*(undefined8 **)(this + 0x20))[1];
  _::concat<kj::ArrayPtr<char_const>,kj::StringPtr&,kj::ArrayPtr<char_const>>
            (&local_28,(_ *)&local_38,(ArrayPtr<const_char> *)(this + 0x28),&local_48,in_R8);
  (__return_storage_ptr__->content).ptr = local_28.content.ptr;
  (__return_storage_ptr__->content).size_ = local_28.content.size_;
  (__return_storage_ptr__->content).disposer = local_28.content.disposer;
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}